

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::MinusEqual<short,int>,short,int,false,std::allocator<unsigned_long>>
               (View<short,_false,_std::allocator<unsigned_long>_> *v,
               View<int,_false,_std::allocator<unsigned_long>_> *w)

{
  int iVar1;
  CoordinateOrder CVar2;
  size_t sVar3;
  size_t sVar4;
  reference psVar5;
  reference piVar6;
  reference psVar7;
  reference piVar8;
  size_t j_1;
  size_t j_2;
  size_t j;
  ulong dimension;
  bool bVar9;
  const_iterator itW;
  Marray<int,_std::allocator<unsigned_long>_> m;
  const_iterator local_a0;
  undefined1 local_70 [72];
  
  Assert<bool>((w->geometry_).size_ != 0 && (v->geometry_).size_ != 0);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 == 0) {
    bVar9 = true;
  }
  else {
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(w);
    bVar9 = sVar3 == sVar4;
  }
  Assert<bool>(bVar9);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 != 0) {
    for (dimension = 0; sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v),
        dimension < sVar3; dimension = dimension + 1) {
      sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,dimension);
      sVar4 = View<int,_false,_std::allocator<unsigned_long>_>::shape(w,dimension);
      Assert<bool>(sVar3 == sVar4);
    }
  }
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(w);
  if (sVar3 == 0) {
    piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)w,0);
    iVar1 = *piVar6;
    local_a0.view_._0_4_ = iVar1;
    bVar9 = View<short,_false,_std::allocator<unsigned_long>_>::isSimple(v);
    if (bVar9) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      sVar3 = (v->geometry_).size_;
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        psVar5[sVar4] = psVar5[sVar4] - (short)iVar1;
      }
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)1,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)3,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_std::allocator<unsigned_long>_>
      ::operate(v,&local_a0,psVar5);
      return;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::begin((iterator *)local_70,v);
    while (bVar9 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore
                             ((iterator *)local_70), bVar9) {
      psVar7 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*
                         ((iterator *)local_70);
      *psVar7 = *psVar7 - (short)local_a0.view_;
      Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++((iterator *)local_70);
    }
  }
  else {
    bVar9 = View<short,false,std::allocator<unsigned_long>>::
            overlaps<int,false,std::allocator<unsigned_long>>
                      ((View<short,false,std::allocator<unsigned_long>> *)v,w);
    if (bVar9) {
      Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
                ((Marray<int,std::allocator<unsigned_long>> *)local_70,w);
      operate<andres::marray_detail::MinusEqual<short,int>,short,int,false,std::allocator<unsigned_long>>
                (v,(Marray<int,std::allocator<unsigned_long>> *)local_70);
      Marray<int,_std::allocator<unsigned_long>_>::~Marray
                ((Marray<int,_std::allocator<unsigned_long>_> *)local_70);
      return;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
    CVar2 = (v->geometry_).coordinateOrder_;
    View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(w);
    if (((CVar2 == (w->geometry_).coordinateOrder_) &&
        (bVar9 = View<short,_false,_std::allocator<unsigned_long>_>::isSimple(v), bVar9)) &&
       (bVar9 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(w), bVar9)) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      sVar3 = (v->geometry_).size_;
      for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
        psVar5[sVar4] = psVar5[sVar4] - (short)piVar6[sVar4];
      }
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 1) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)1,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 2) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 3) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 4) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 5) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 6) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 7) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 8) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 9) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    sVar3 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar3 == 10) {
      psVar5 = View<short,false,std::allocator<unsigned_long>>::operator()
                         ((View<short,false,std::allocator<unsigned_long>> *)v,0);
      piVar6 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)w,0);
      OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::MinusEqual<short,_int>,_short,_int,_false,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operate(v,w,psVar5,piVar6);
      return;
    }
    View<short,_false,_std::allocator<unsigned_long>_>::begin((iterator *)local_70,v);
    View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_a0,w);
    while (bVar9 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore
                             ((Iterator<short,_false,_std::allocator<unsigned_long>_> *)local_70),
          bVar9) {
      bVar9 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_a0);
      Assert<bool>(bVar9);
      psVar7 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*
                         ((Iterator<short,_false,_std::allocator<unsigned_long>_> *)local_70);
      piVar8 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&local_a0);
      *psVar7 = *psVar7 - (short)*piVar8;
      Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++
                ((Iterator<short,_false,_std::allocator<unsigned_long>_> *)local_70);
      Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_a0);
    }
    bVar9 = Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore(&local_a0);
    Assert<bool>(!bVar9);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_a0.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_70 + 0x18));
  return;
}

Assistant:

inline void 
operate
(
    View<T1, false, A>& v, 
    const View<T2, isConst, A>& w, 
    Functor f
)
{
    if(!MARRAY_NO_ARG_TEST) {
        Assert(v.size() != 0 && w.size() != 0);
        Assert(w.dimension() == 0 || v.dimension() == w.dimension());
        if(w.dimension() != 0) {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == w.shape(j));
            }
        }
    }
    if(w.dimension() == 0) {
        T2 x = w(0);
        if(v.isSimple()) {
            T1* dataV = &v(0);
            for(std::size_t j=0; j<v.size(); ++j) {
                f(dataV[j], x);
            }
        }
        else if(v.dimension() == 1)
            OperateHelperBinaryScalar<1, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 2)
            OperateHelperBinaryScalar<2, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 3)
            OperateHelperBinaryScalar<3, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 4)
            OperateHelperBinaryScalar<4, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 5)
            OperateHelperBinaryScalar<5, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 6)
            OperateHelperBinaryScalar<6, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 7)
            OperateHelperBinaryScalar<7, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 8)
            OperateHelperBinaryScalar<8, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 9)
            OperateHelperBinaryScalar<9, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else if(v.dimension() == 10)
            OperateHelperBinaryScalar<10, Functor, T1, T2, A>::operate(v, x, f, &v(0));
        else {
            for(typename View<T1, false>::iterator it = v.begin(); it.hasMore(); ++it) {
                f(*it, x);
            }
        }
    }
    else {
        if(v.overlaps(w)) {
            Marray<T2> m = w; // temporary copy
            operate(v, m, f); // recursive call
        }
        else {
            if(v.coordinateOrder() == w.coordinateOrder() 
                && v.isSimple() && w.isSimple()) {
                T1* dataV = &v(0);
                const T2* dataW = &w(0);
                for(std::size_t j=0; j<v.size(); ++j) {
                    f(dataV[j], dataW[j]);
                }
            }
            else if(v.dimension() == 1)
                OperateHelperBinary<1, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 2)
                OperateHelperBinary<2, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 3)
                OperateHelperBinary<3, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 4)
                OperateHelperBinary<4, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 5)
                OperateHelperBinary<5, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 6)
                OperateHelperBinary<6, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 7)
                OperateHelperBinary<7, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 8)
                OperateHelperBinary<8, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 9)
                OperateHelperBinary<9, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else if(v.dimension() == 10)
                OperateHelperBinary<10, Functor, T1, T2, isConst, A, A>::operate(v, w, f, &v(0), &w(0));
            else {
                typename View<T1, false>::iterator itV = v.begin();
                typename View<T2, isConst>::const_iterator itW = w.begin();
                for(; itV.hasMore(); ++itV, ++itW) {
                    Assert(MARRAY_NO_DEBUG || itW.hasMore());
                    f(*itV, *itW);
                }
                Assert(MARRAY_NO_DEBUG || !itW.hasMore());
            }
        }
    }
}